

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::FloatDatatypeValidator::serialize
          (FloatDatatypeValidator *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  FloatDatatypeValidator *this_local;
  
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::operator<<(serEng,0);
  }
  AbstractNumericValidator::serialize(&this->super_AbstractNumericValidator,serEng);
  return;
}

Assistant:

void FloatDatatypeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     * Note: 
     *
     *     During storing, we need write the specific number
     *     type info before calling base::serialize().
     *
     *     While loading, we do nothing here
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) (XMLNumber::Float);
    }

    AbstractNumericValidator::serialize(serEng);

}